

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall
GlobOpt::CaptureValuesFromScratch
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pJVar2;
  Type pBVar3;
  ValueInfo *pVVar4;
  Sym *pSVar5;
  StackSym *param1;
  Value *val;
  long lVar6;
  code *pcVar7;
  int iVar8;
  bool bVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  HashBucket *pHVar12;
  VarConstantValueInfo *pVVar13;
  Type_conflict pBVar14;
  ulong uVar15;
  Type pSVar16;
  JitArenaAllocator *allocator;
  Type_conflict pBVar17;
  ulong uVar19;
  Type pSVar20;
  GlobHashTable *pGVar21;
  NodeBase *pNVar22;
  BailoutConstantValue param2;
  int local_5c;
  BVSparse<Memory::JitArenaAllocator> *pBStack_58;
  int intConstantValue;
  GlobOpt *local_50;
  undefined1 local_48 [8];
  Iterator __iter;
  anon_union_8_3_5e50e90d_for_u aVar18;
  
  pBVar1 = (block->globOptData).changedSyms;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar17 = pJVar2->bvFreeList;
    do {
      pBVar14 = pBVar3;
      pBVar3 = pBVar14->next;
      pBVar14->next = pBVar17;
      pBVar17 = pBVar14;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar14;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  pGVar21 = (block->globOptData).symToValueMap;
  pBStack_58 = argsToCapture;
  local_50 = this;
  __iter.current = (NodeBase *)block;
  if (pGVar21->tableSize != 0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar19 = 0;
    do {
      local_48 = (undefined1  [8])(pGVar21->table + uVar19);
      __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    local_48;
      while( true ) {
        if (__iter.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar9) goto LAB_0048f5c6;
          *puVar10 = 0;
        }
        __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_48) break;
        pTVar11 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        pVVar4 = pTVar11->element->valueInfo;
        if ((((pVVar4->symStore != (Sym *)0x0) ||
             (bVar9 = ValueInfo::HasIntConstantValue(pVVar4,false), bVar9)) &&
            (pSVar5 = pTVar11->value, pSVar5 != (Sym *)0x0)) &&
           ((pSVar5->m_kind == SymKindStack && (((ulong)pSVar5[1]._vptr_Sym & 0x2000) != 0)))) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x31].next,pSVar5->m_id);
        }
      }
      uVar19 = uVar19 + 1;
      pGVar21 = (GlobHashTable *)__iter.current[0x1a].next;
      __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    } while (uVar19 < pGVar21->tableSize);
  }
  pNVar22 = __iter.current;
  if (pBStack_58 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x31].next,pBStack_58);
  }
  pSVar16 = (pNVar22[0x31].next)->next;
  if (pSVar16 != (Type)0x0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pSVar20 = pSVar16[2].next;
      if (pSVar20 != (Type)0x0) {
        pBStack_58 = (BVSparse<Memory::JitArenaAllocator> *)(ulong)*(uint *)&pSVar16[1].next;
        uVar19 = 0;
        if (pSVar20 != (Type)0x0) {
          for (; ((ulong)pSVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        do {
          iVar8 = (int)pBStack_58;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19);
          pHVar12 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                              ((ValueHashTable<Sym_*,_Value_*> *)pNVar22[0x1a].next,
                               (BVIndex)uVar19 + iVar8);
          param1 = (StackSym *)pHVar12->value;
          if ((param1->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar9) {
LAB_0048f5c6:
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            *puVar10 = 0;
          }
          val = pHVar12->element;
          pVVar4 = val->valueInfo;
          bVar9 = ValueInfo::TryGetIntConstantValue(pVVar4,&local_5c,false);
          if (bVar9) {
            allocator = local_50->func->m_alloc;
            uVar15 = 3;
            aVar18 = (anon_union_8_3_5e50e90d_for_u)(long)local_5c;
LAB_0048f561:
            param2.u = aVar18;
            param2._0_8_ = uVar15;
            SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
            ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                      ((EditingIterator *)bailOutConstValuesIter,&allocator->super_ArenaAllocator,
                       param1,param2);
            pNVar22 = __iter.current;
          }
          else {
            bVar9 = ValueInfo::IsVarConstant(pVVar4);
            pNVar22 = __iter.current;
            if (bVar9) {
              pVVar13 = ValueInfo::AsVarConstant(pVVar4);
              BailoutConstantValue::InitVarConstValue
                        ((BailoutConstantValue *)local_48,pVVar13->varValue);
              allocator = local_50->func->m_alloc;
              uVar15 = (ulong)local_48 & 0xffffffff;
              aVar18 = (anon_union_8_3_5e50e90d_for_u)__iter.list;
              goto LAB_0048f561;
            }
            CaptureCopyPropValue
                      (local_50,(BasicBlock *)__iter.current,(Sym *)param1,val,bailOutCopySymsIter);
          }
          pSVar20 = (Type)((ulong)pSVar20 & ~(1L << (uVar19 & 0x3f)));
          lVar6 = 0;
          if (pSVar20 != (Type)0x0) {
            for (; ((ulong)pSVar20 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar19 = (ulong)(-(uint)(pSVar20 == (Type)0x0) | (uint)lVar6);
        } while (pSVar20 != (Type)0x0);
      }
      pSVar16 = pSVar16->next;
    } while (pSVar16 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureValuesFromScratch(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    Sym * sym = nullptr;
    Value * value = nullptr;
    ValueInfo * valueInfo = nullptr;

    block->globOptData.changedSyms->ClearAll();

    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, block->globOptData.symToValueMap)
    {
        value = bucket.element;
        valueInfo = value->GetValueInfo();

        if (valueInfo->GetSymStore() == nullptr && !valueInfo->HasIntConstantValue())
        {
            continue;
        }

        sym = bucket.value;
        if (sym == nullptr || !sym->IsStackSym() || !(sym->AsStackSym()->HasByteCodeRegSlot()))
        {
            continue;
        }
        block->globOptData.changedSyms->Set(sym->m_id);
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        HashBucket<Sym*, Value*> * bucket = block->globOptData.symToValueMap->GetBucket(symId);
        StackSym * stackSym = bucket->value->AsStackSym();
        value =  bucket->element;
        valueInfo = value->GetValueInfo();

        int intConstantValue;
        if (valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            BailoutConstantValue constValue;
            constValue.InitIntConstValue(intConstantValue);
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else if (valueInfo->IsVarConstant())
        {
            BailoutConstantValue constValue;
            constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else
        {
            CaptureCopyPropValue(block, stackSym, value, bailOutCopySymsIter);
        }
    }
    NEXT_BITSET_IN_SPARSEBV
}